

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
moveAppend(QGenericArrayOps<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> *this,
          pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *b,
          pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *e)

{
  undefined8 uVar1;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar2;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    ppVar2 = QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
             begin((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                    *)0x8aa7f7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      ppVar3 = ppVar2 + *(long *)(in_RDI + 0x10);
      uVar1 = *local_10;
      (ppVar3->first).r = (int)uVar1;
      (ppVar3->first).c = (int)((ulong)uVar1 >> 0x20);
      (ppVar3->first).i = local_10[1];
      (ppVar3->first).m.ptr = (QAbstractItemModel *)local_10[2];
      ppVar3->second = (Mapping *)local_10[3];
      local_10 = local_10 + 4;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }